

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQOuter::~SQOuter(SQOuter *this)

{
  SQCollectable_conflict *in_RDI;
  
  (in_RDI->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQOuter_0021c100;
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  SQCollectable::~SQCollectable((SQCollectable *)0x15fe26);
  return;
}

Assistant:

~SQOuter() { REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this); }